

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O3

void ImGui_ImplOpenGL3_LoadState(int id)

{
  mapped_type *pmVar1;
  key_type local_4;
  
  pmVar1 = std::map<int,_State,_std::less<int>,_std::allocator<std::pair<const_int,_State>_>_>::
           operator[](&g_state,&local_4);
  g_FontTexture = *(GLuint *)&pmVar1->Window;
  g_ShaderHandle = *(GLuint *)((long)&pmVar1->Window + 4);
  g_VertHandle = (GLuint)pmVar1->Time;
  g_FragHandle = *(GLuint *)((long)&pmVar1->Time + 4);
  g_AttribLocationTex._0_1_ = pmVar1->MousePressed[0];
  g_AttribLocationTex._1_1_ = pmVar1->MousePressed[1];
  g_AttribLocationTex._2_1_ = pmVar1->MousePressed[2];
  g_AttribLocationTex._3_1_ = pmVar1->field_0x13;
  g_AttribLocationProjMtx = *(int *)&pmVar1->field_0x14;
  g_AttribLocationVtxPos = *(int *)pmVar1->MouseCursors;
  g_AttribLocationVtxUV = *(int *)((long)pmVar1->MouseCursors + 4);
  g_AttribLocationVtxColor = *(int *)(pmVar1->MouseCursors + 1);
  g_VboHandle = *(uint *)((long)pmVar1->MouseCursors + 0xc);
  g_ElementsHandle = *(uint *)(pmVar1->MouseCursors + 2);
  return;
}

Assistant:

void ImGui_ImplOpenGL3_LoadState(int id) {
    const auto & src = g_state[id];

    g_FontTexture               = src.FontTexture;
    g_ShaderHandle              = src.ShaderHandle;
    g_VertHandle                = src.VertHandle;
    g_FragHandle                = src.FragHandle;
    g_AttribLocationTex         = src.AttribLocationTex;
    g_AttribLocationProjMtx     = src.AttribLocationProjMtx;
    g_AttribLocationVtxPos      = src.AttribLocationVtxPos;
    g_AttribLocationVtxUV       = src.AttribLocationVtxUV;
    g_AttribLocationVtxColor    = src.AttribLocationVtxColor;
    g_VboHandle                 = src.VboHandle;
    g_ElementsHandle            = src.ElementsHandle;
}